

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

uint aom_masked_sub_pixel_variance16x64_ssse3
               (uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *ref,int ref_stride,
               uint8_t *second_pred,uint8_t *msk,int msk_stride,int invert_mask,uint *sse)

{
  int in_stack_00000020;
  int *in_stack_00000028;
  uint8_t temp [1040];
  int sum;
  int in_stack_fffffffffffffbe4;
  uint8_t *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf4;
  uint8_t *in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffc04;
  uint8_t *in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffcb4;
  uint8_t *in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcc4;
  int in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  uint8_t *in_stack_fffffffffffffcd0;
  uint8_t *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  uint *in_stack_fffffffffffffd00;
  int *in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffe60;
  undefined4 local_30;
  
  bilinear_filter(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,
                  in_stack_fffffffffffffcc4,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,
                  in_stack_fffffffffffffe60);
  if (in_stack_00000020 == 0) {
    masked_variance(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
                    in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                    in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0,
                    in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  }
  else {
    masked_variance(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
                    in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                    in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0,
                    in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  }
  return *in_stack_00000028 - (int)(((long)local_30 * (long)local_30) / 0x400);
}

Assistant:

static inline __m128i filter_block(const __m128i a, const __m128i b,
                                   const __m128i filter) {
  __m128i v0 = _mm_unpacklo_epi8(a, b);
  v0 = _mm_maddubs_epi16(v0, filter);
  v0 = xx_roundn_epu16(v0, FILTER_BITS);

  __m128i v1 = _mm_unpackhi_epi8(a, b);
  v1 = _mm_maddubs_epi16(v1, filter);
  v1 = xx_roundn_epu16(v1, FILTER_BITS);

  return _mm_packus_epi16(v0, v1);
}